

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void make_unique_names(vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *headers)

{
  reference pvVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  size_type sVar5;
  invalid_argument *this;
  string *psVar6;
  ostream *poVar7;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  size_t backup;
  ostringstream s;
  string base_name;
  Header *h;
  size_t i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd38;
  byte in_stack_fffffffffffffd3f;
  iterator in_stack_fffffffffffffd40;
  string local_258 [32];
  _Self local_238;
  string local_230 [32];
  _Self local_210;
  ulong local_208;
  long local_200 [47];
  _Self local_88;
  _Self local_80 [3];
  string local_68 [32];
  reference local_48;
  ulong local_40;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *local_8;
  
  local_8 = in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1091cc);
  local_40 = 0;
  while( true ) {
    uVar2 = local_40;
    sVar5 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size(local_8);
    if (sVar5 <= uVar2) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1095fe);
      return;
    }
    local_48 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                         (local_8,local_40);
    std::__cxx11::string::string(local_68);
    bVar3 = Imf_3_2::Header::hasName();
    if ((bVar3 & 1) == 0) break;
    psVar6 = (string *)Imf_3_2::Header::name_abi_cxx11_();
    std::__cxx11::string::operator=(local_68,psVar6);
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20._M_node);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
    bVar4 = std::operator!=(local_80,&local_88);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      local_208 = 1;
      do {
        std::ios::clear((long)local_200 + *(long *)(local_200[0] + -0x18),0);
        psVar6 = (string *)Imf_3_2::Header::name_abi_cxx11_();
        poVar7 = std::operator<<((ostream *)local_200,psVar6);
        poVar7 = std::operator<<(poVar7,"_");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40);
        poVar7 = std::operator<<(poVar7,"_");
        std::ostream::operator<<(poVar7,local_208);
        local_208 = local_208 + 1;
        std::__cxx11::ostringstream::str();
        in_stack_fffffffffffffd40 =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20._M_node);
        local_210._M_node = in_stack_fffffffffffffd40._M_node;
        local_238._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
        in_stack_fffffffffffffd3f = std::operator!=(&local_210,&local_238);
        std::__cxx11::string::~string(local_230);
        pvVar1 = local_48;
      } while ((in_stack_fffffffffffffd3f & 1) != 0);
      std::__cxx11::ostringstream::str();
      Imf_3_2::Header::setName((string *)pvVar1);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    }
    in_stack_fffffffffffffd28 =
         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)Imf_3_2::Header::name_abi_cxx11_();
    pVar8 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd40._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    in_stack_fffffffffffffd20 = pVar8.first._M_node;
    in_stack_fffffffffffffd1f = pVar8.second;
    std::__cxx11::string::~string(local_68);
    local_40 = local_40 + 1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Software Error: header does not have a valid name");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
make_unique_names (vector<Header>& headers)
{
    set<string> names;
    for (size_t i = 0; i < headers.size (); i++)
    {
        Header&     h = headers[i];
        std::string base_name;

        // if no name at all, set it to <type><partnum> (first part is part 1)
        if (!h.hasName ())
        {
            // We should not be here, we have populated all headers with names.
            throw invalid_argument("Software Error: header does not have a valid name");
        }
        else
        {
            base_name = h.name ();
        }

        // check name has already been used, if so add a _<number> to it
        if (names.find (base_name) != names.end ())
        {
            ostringstream s;
            size_t        backup = 1;
            do
            {
                s.clear ();
                s << h.name () << "_" << i << "_" << backup;
                backup++;
            } while (names.find (s.str ()) != names.end ());
            h.setName (s.str ());
        }

        names.insert (h.name ());
    }
}